

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormat::setRoundingIncrement(DecimalFormat *this,double newValue)

{
  double dVar1;
  DecimalFormatProperties *pDVar2;
  
  pDVar2 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  dVar1 = pDVar2->roundingIncrement;
  if ((dVar1 == newValue) && (!NAN(dVar1) && !NAN(newValue))) {
    return;
  }
  pDVar2->roundingIncrement = newValue;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setRoundingIncrement(double newValue) {
    if (newValue == fields->properties->roundingIncrement) { return; }
    fields->properties->roundingIncrement = newValue;
    touchNoError();
}